

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::UpdateNextBranchIslandOffset
          (ByteCodeWriter *this,uint firstUnknownJumpInfo,uint firstUnknownJumpOffset)

{
  int32 iVar1;
  
  this->firstUnknownJumpInfo = firstUnknownJumpInfo;
  iVar1 = GetBranchLimit();
  this->nextBranchIslandOffset =
       iVar1 + firstUnknownJumpOffset +
       ((this->m_jumpOffsets->
        super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>).
        count - firstUnknownJumpInfo) * -7 + -0x51;
  return;
}

Assistant:

void ByteCodeWriter::UpdateNextBranchIslandOffset(uint firstUnknownJumpInfo, uint firstUnknownJumpOffset)
    {
        this->firstUnknownJumpInfo = firstUnknownJumpInfo;

        // We will need to emit the next branch from the first branch + branch limit.
        // But leave room for the jump around and one extra byte code instruction.
        // Also account for all the long branches we may have to emit as well.
        this->nextBranchIslandOffset = firstUnknownJumpOffset + GetBranchLimit()
            - JumpAroundSize - MaxLayoutSize - MaxOpCodeSize - LongBranchSize * (m_jumpOffsets->Count() - firstUnknownJumpInfo);
    }